

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int dtdCopy(XML_Parser oldParser,DTD *newDtd,DTD *oldDtd,XML_Memory_Handling_Suite *ms)

{
  undefined4 uVar1;
  XML_Bool XVar2;
  int iVar3;
  NAMED *pNVar4;
  XML_Char *pXVar5;
  NAMED *pNVar6;
  KEY pXVar7;
  NAMED *pNVar8;
  ELEMENT_TYPE *oldE;
  XML_Char *name_2;
  ELEMENT_TYPE *newE;
  int i;
  ATTRIBUTE_ID *oldA;
  XML_Char *name_1;
  ATTRIBUTE_ID *newA;
  PREFIX *oldP;
  XML_Char *name;
  HASH_TABLE_ITER iter;
  XML_Memory_Handling_Suite *ms_local;
  DTD *oldDtd_local;
  DTD *newDtd_local;
  XML_Parser oldParser_local;
  
  iter.end = (NAMED **)ms;
  hashTableIterInit((HASH_TABLE_ITER *)&name,&oldDtd->prefixes);
  do {
    pNVar4 = hashTableIterNext((HASH_TABLE_ITER *)&name);
    if (pNVar4 == (NAMED *)0x0) {
      hashTableIterInit((HASH_TABLE_ITER *)&name,&oldDtd->attributeIds);
      while( true ) {
        pNVar4 = hashTableIterNext((HASH_TABLE_ITER *)&name);
        if (pNVar4 == (NAMED *)0x0) {
          hashTableIterInit((HASH_TABLE_ITER *)&name,&oldDtd->elementTypes);
          while( true ) {
            pNVar4 = hashTableIterNext((HASH_TABLE_ITER *)&name);
            if (pNVar4 == (NAMED *)0x0) {
              iVar3 = copyEntityTable(oldParser,&newDtd->generalEntities,&newDtd->pool,
                                      &oldDtd->generalEntities);
              if (iVar3 != 0) {
                newDtd->keepProcessing = oldDtd->keepProcessing;
                newDtd->hasParamEntityRefs = oldDtd->hasParamEntityRefs;
                newDtd->standalone = oldDtd->standalone;
                newDtd->in_eldecl = oldDtd->in_eldecl;
                newDtd->scaffold = oldDtd->scaffold;
                newDtd->contentStringLen = oldDtd->contentStringLen;
                newDtd->scaffSize = oldDtd->scaffSize;
                newDtd->scaffLevel = oldDtd->scaffLevel;
                newDtd->scaffIndex = oldDtd->scaffIndex;
              }
              oldParser_local._4_4_ = (uint)(iVar3 != 0);
              return oldParser_local._4_4_;
            }
            pXVar5 = poolCopyString(&newDtd->pool,pNVar4->name);
            if (pXVar5 == (XML_Char *)0x0) break;
            pNVar6 = lookup(oldParser,&newDtd->elementTypes,pXVar5,0x28);
            if (pNVar6 == (NAMED *)0x0) {
              return 0;
            }
            if (*(int *)&pNVar4[3].name != 0) {
              pXVar7 = (KEY)(*(code *)*iter.end)((long)*(int *)&pNVar4[3].name * 0x18);
              pNVar6[4].name = pXVar7;
              if (pNVar6[4].name == (KEY)0x0) {
                return 0;
              }
            }
            if (pNVar4[2].name != (KEY)0x0) {
              pNVar8 = lookup(oldParser,&newDtd->attributeIds,*(KEY *)pNVar4[2].name,0);
              pNVar6[2].name = (KEY)pNVar8;
            }
            uVar1 = *(undefined4 *)&pNVar4[3].name;
            *(undefined4 *)&pNVar6[3].name = uVar1;
            *(undefined4 *)((long)&pNVar6[3].name + 4) = uVar1;
            if (pNVar4[1].name != (KEY)0x0) {
              pNVar8 = lookup(oldParser,&newDtd->prefixes,*(KEY *)pNVar4[1].name,0);
              pNVar6[1].name = (KEY)pNVar8;
            }
            for (newE._4_4_ = 0; newE._4_4_ < *(int *)&pNVar6[3].name; newE._4_4_ = newE._4_4_ + 1)
            {
              pNVar8 = lookup(oldParser,&newDtd->attributeIds,
                              (KEY)**(undefined8 **)(pNVar4[4].name + (long)newE._4_4_ * 0x18),0);
              *(NAMED **)(pNVar6[4].name + (long)newE._4_4_ * 0x18) = pNVar8;
              pNVar6[4].name[(long)newE._4_4_ * 0x18 + 8] =
                   pNVar4[4].name[(long)newE._4_4_ * 0x18 + 8];
              if (*(long *)(pNVar4[4].name + (long)newE._4_4_ * 0x18 + 0x10) == 0) {
                pXVar7 = pNVar6[4].name + (long)newE._4_4_ * 0x18 + 0x10;
                pXVar7[0] = '\0';
                pXVar7[1] = '\0';
                pXVar7[2] = '\0';
                pXVar7[3] = '\0';
                pXVar7[4] = '\0';
                pXVar7[5] = '\0';
                pXVar7[6] = '\0';
                pXVar7[7] = '\0';
              }
              else {
                pXVar5 = poolCopyString(&newDtd->pool,
                                        *(XML_Char **)
                                         (pNVar4[4].name + (long)newE._4_4_ * 0x18 + 0x10));
                *(XML_Char **)(pNVar6[4].name + (long)newE._4_4_ * 0x18 + 0x10) = pXVar5;
                if (*(long *)(pNVar6[4].name + (long)newE._4_4_ * 0x18 + 0x10) == 0) {
                  return 0;
                }
              }
            }
          }
          return 0;
        }
        if (((newDtd->pool).ptr == (newDtd->pool).end) &&
           (XVar2 = poolGrow(&newDtd->pool), XVar2 == '\0')) {
          return 0;
        }
        pXVar5 = (newDtd->pool).ptr;
        (newDtd->pool).ptr = pXVar5 + 1;
        *pXVar5 = '\0';
        pXVar5 = poolCopyString(&newDtd->pool,pNVar4->name);
        if (pXVar5 == (XML_Char *)0x0) {
          return 0;
        }
        pNVar6 = lookup(oldParser,&newDtd->attributeIds,pXVar5 + 1,0x18);
        if (pNVar6 == (NAMED *)0x0) break;
        *(undefined1 *)&pNVar6[2].name = *(undefined1 *)&pNVar4[2].name;
        if (pNVar4[1].name != (KEY)0x0) {
          *(undefined1 *)((long)&pNVar6[2].name + 1) = *(undefined1 *)((long)&pNVar4[2].name + 1);
          if ((PREFIX *)pNVar4[1].name == &oldDtd->defaultPrefix) {
            pNVar6[1].name = (KEY)&newDtd->defaultPrefix;
          }
          else {
            pNVar4 = lookup(oldParser,&newDtd->prefixes,*(KEY *)pNVar4[1].name,0);
            pNVar6[1].name = (KEY)pNVar4;
          }
        }
      }
      return 0;
    }
    pXVar5 = poolCopyString(&newDtd->pool,pNVar4->name);
    if (pXVar5 == (XML_Char *)0x0) {
      return 0;
    }
    pNVar4 = lookup(oldParser,&newDtd->prefixes,pXVar5,0x10);
  } while (pNVar4 != (NAMED *)0x0);
  return 0;
}

Assistant:

static int
dtdCopy(XML_Parser oldParser, DTD *newDtd, const DTD *oldDtd,
        const XML_Memory_Handling_Suite *ms) {
  HASH_TABLE_ITER iter;

  /* Copy the prefix table. */

  hashTableIterInit(&iter, &(oldDtd->prefixes));
  for (;;) {
    const XML_Char *name;
    const PREFIX *oldP = (PREFIX *)hashTableIterNext(&iter);
    if (! oldP)
      break;
    name = poolCopyString(&(newDtd->pool), oldP->name);
    if (! name)
      return 0;
    if (! lookup(oldParser, &(newDtd->prefixes), name, sizeof(PREFIX)))
      return 0;
  }

  hashTableIterInit(&iter, &(oldDtd->attributeIds));

  /* Copy the attribute id table. */

  for (;;) {
    ATTRIBUTE_ID *newA;
    const XML_Char *name;
    const ATTRIBUTE_ID *oldA = (ATTRIBUTE_ID *)hashTableIterNext(&iter);

    if (! oldA)
      break;
    /* Remember to allocate the scratch byte before the name. */
    if (! poolAppendChar(&(newDtd->pool), XML_T('\0')))
      return 0;
    name = poolCopyString(&(newDtd->pool), oldA->name);
    if (! name)
      return 0;
    ++name;
    newA = (ATTRIBUTE_ID *)lookup(oldParser, &(newDtd->attributeIds), name,
                                  sizeof(ATTRIBUTE_ID));
    if (! newA)
      return 0;
    newA->maybeTokenized = oldA->maybeTokenized;
    if (oldA->prefix) {
      newA->xmlns = oldA->xmlns;
      if (oldA->prefix == &oldDtd->defaultPrefix)
        newA->prefix = &newDtd->defaultPrefix;
      else
        newA->prefix = (PREFIX *)lookup(oldParser, &(newDtd->prefixes),
                                        oldA->prefix->name, 0);
    }
  }

  /* Copy the element type table. */

  hashTableIterInit(&iter, &(oldDtd->elementTypes));

  for (;;) {
    int i;
    ELEMENT_TYPE *newE;
    const XML_Char *name;
    const ELEMENT_TYPE *oldE = (ELEMENT_TYPE *)hashTableIterNext(&iter);
    if (! oldE)
      break;
    name = poolCopyString(&(newDtd->pool), oldE->name);
    if (! name)
      return 0;
    newE = (ELEMENT_TYPE *)lookup(oldParser, &(newDtd->elementTypes), name,
                                  sizeof(ELEMENT_TYPE));
    if (! newE)
      return 0;
    if (oldE->nDefaultAtts) {
      newE->defaultAtts
          = ms->malloc_fcn(oldE->nDefaultAtts * sizeof(DEFAULT_ATTRIBUTE));
      if (! newE->defaultAtts) {
        return 0;
      }
    }
    if (oldE->idAtt)
      newE->idAtt = (ATTRIBUTE_ID *)lookup(oldParser, &(newDtd->attributeIds),
                                           oldE->idAtt->name, 0);
    newE->allocDefaultAtts = newE->nDefaultAtts = oldE->nDefaultAtts;
    if (oldE->prefix)
      newE->prefix = (PREFIX *)lookup(oldParser, &(newDtd->prefixes),
                                      oldE->prefix->name, 0);
    for (i = 0; i < newE->nDefaultAtts; i++) {
      newE->defaultAtts[i].id = (ATTRIBUTE_ID *)lookup(
          oldParser, &(newDtd->attributeIds), oldE->defaultAtts[i].id->name, 0);
      newE->defaultAtts[i].isCdata = oldE->defaultAtts[i].isCdata;
      if (oldE->defaultAtts[i].value) {
        newE->defaultAtts[i].value
            = poolCopyString(&(newDtd->pool), oldE->defaultAtts[i].value);
        if (! newE->defaultAtts[i].value)
          return 0;
      } else
        newE->defaultAtts[i].value = NULL;
    }
  }

  /* Copy the entity tables. */
  if (! copyEntityTable(oldParser, &(newDtd->generalEntities), &(newDtd->pool),
                        &(oldDtd->generalEntities)))
    return 0;

#ifdef XML_DTD
  if (! copyEntityTable(oldParser, &(newDtd->paramEntities), &(newDtd->pool),
                        &(oldDtd->paramEntities)))
    return 0;
  newDtd->paramEntityRead = oldDtd->paramEntityRead;
#endif /* XML_DTD */

  newDtd->keepProcessing = oldDtd->keepProcessing;
  newDtd->hasParamEntityRefs = oldDtd->hasParamEntityRefs;
  newDtd->standalone = oldDtd->standalone;

  /* Don't want deep copying for scaffolding */
  newDtd->in_eldecl = oldDtd->in_eldecl;
  newDtd->scaffold = oldDtd->scaffold;
  newDtd->contentStringLen = oldDtd->contentStringLen;
  newDtd->scaffSize = oldDtd->scaffSize;
  newDtd->scaffLevel = oldDtd->scaffLevel;
  newDtd->scaffIndex = oldDtd->scaffIndex;

  return 1;
}